

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O3

bool __thiscall
QUrlPrivate::validateComponent
          (QUrlPrivate *this,Section section,QString *input,qsizetype begin,qsizetype end)

{
  char16_t cVar1;
  uint uVar2;
  char16_t *pcVar3;
  void *pvVar4;
  Error *this_00;
  long lVar5;
  ErrorCode EVar6;
  long lVar7;
  bool bVar8;
  
  pcVar3 = (input->d).ptr;
  if (pcVar3 == (char16_t *)0x0) {
    pcVar3 = &QString::_empty;
  }
  if ((ulong)begin < (ulong)end) {
    lVar7 = 0;
    bVar8 = false;
    do {
      cVar1 = pcVar3[begin + lVar7];
      if (0x7f < (ushort)cVar1) goto LAB_0025afa6;
      if (cVar1 == L'%') {
        if (((begin + lVar7 + 2U <= (ulong)end) &&
            ((uVar2 = (int)(char)pcVar3[begin + lVar7 + 1] | 0x20, (byte)((char)uVar2 + 0x9fU) < 6
             || (uVar2 - 0x30 < 10)))) &&
           ((uVar2 = (int)(char)pcVar3[begin + lVar7 + 2] | 0x20, (byte)((char)uVar2 + 0x9fU) < 6 ||
            (uVar2 - 0x30 < 10)))) goto LAB_0025af33;
LAB_0025afcd:
        if (section != UserInfo) {
LAB_0025b004:
          EVar6 = (uint)section << 8;
          goto LAB_0025b011;
        }
LAB_0025afd4:
        EVar6 = InvalidUserNameError;
        if ((ulong)(begin + lVar7) <= (ulong)begin) goto LAB_0025b011;
        pcVar3 = pcVar3 + begin;
        lVar5 = lVar7;
        goto LAB_0025aff3;
      }
      if ((ushort)cVar1 < 0x21) goto LAB_0025afcd;
LAB_0025af33:
      pvVar4 = memchr("\"<>\\^`{|}\x7f",(uint)(ushort)cVar1,0xb);
      if (pvVar4 != (void *)0x0) goto LAB_0025afcd;
      if ((section & UserInfo) != ~FullUrl) {
        if (section != UserInfo) {
          pvVar4 = memchr(":/?#[]@",(uint)(ushort)cVar1,8);
          if (pvVar4 == (void *)0x0) goto LAB_0025afa6;
          goto LAB_0025b004;
        }
        pvVar4 = memchr("/?#[]@",(uint)(ushort)cVar1,7);
        if (pvVar4 == (void *)0x0) goto LAB_0025afa6;
        goto LAB_0025afd4;
      }
LAB_0025afa6:
      bVar8 = (ulong)end <= lVar7 + begin + 1U;
      lVar7 = lVar7 + 1;
    } while ((begin - end) + lVar7 != 0);
  }
  return true;
  while( true ) {
    pcVar3 = pcVar3 + 1;
    lVar5 = lVar5 + -1;
    EVar6 = InvalidUserNameError;
    if (lVar5 == 0) break;
LAB_0025aff3:
    if (*pcVar3 == L':') {
      EVar6 = InvalidPasswordError;
      break;
    }
  }
LAB_0025b011:
  if ((this->error)._M_t.
      super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
      super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
      super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl == (Error *)0x0) {
    this_00 = (Error *)operator_new(0x28);
    (this_00->source).d.d = (Data *)0x0;
    (this_00->source).d.ptr = (char16_t *)0x0;
    (this_00->source).d.size = 0;
    this_00->position = 0;
    *(undefined8 *)&this_00->code = 0;
    (this->error)._M_t.
    super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
    super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
    super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl = this_00;
    this_00->code = EVar6;
    QString::operator=((QString *)this_00,input);
    ((this->error)._M_t.
     super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
     super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
     super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl)->position = begin + lVar7;
  }
  return bVar8;
}

Assistant:

bool QUrlPrivate::validateComponent(QUrlPrivate::Section section, const QString &input,
                                    qsizetype begin, qsizetype end)
{
    // What we need to look out for, that the regular parser tolerates:
    //  - percent signs not followed by two hex digits
    //  - forbidden characters, which should always appear encoded
    //    '"' / '<' / '>' / '\' / '^' / '`' / '{' / '|' / '}' / BKSP
    //    control characters
    //  - delimiters not allowed in certain positions
    //    . scheme: parser is already strict
    //    . user info: gen-delims except ":" disallowed ("/" / "?" / "#" / "[" / "]" / "@")
    //    . host: parser is stricter than the standard
    //    . port: parser is stricter than the standard
    //    . path: all delimiters allowed
    //    . fragment: all delimiters allowed
    //    . query: all delimiters allowed
    static const char forbidden[] = "\"<>\\^`{|}\x7F";
    static const char forbiddenUserInfo[] = ":/?#[]@";

    Q_ASSERT(section != Authority && section != Hierarchy && section != FullUrl);

    const ushort *const data = reinterpret_cast<const ushort *>(input.constData());
    for (size_t i = size_t(begin); i < size_t(end); ++i) {
        uint uc = data[i];
        if (uc >= 0x80)
            continue;

        bool error = false;
        if ((uc == '%' && (size_t(end) < i + 2 || !isHex(data[i + 1]) || !isHex(data[i + 2])))
                || uc <= 0x20 || strchr(forbidden, uc)) {
            // found an error
            error = true;
        } else if (section & UserInfo) {
            if (section == UserInfo && strchr(forbiddenUserInfo + 1, uc))
                error = true;
            else if (section != UserInfo && strchr(forbiddenUserInfo, uc))
                error = true;
        }

        if (!error)
            continue;

        ErrorCode errorCode = ErrorCode(int(section) << 8);
        if (section == UserInfo) {
            // is it the user name or the password?
            errorCode = InvalidUserNameError;
            for (size_t j = size_t(begin); j < i; ++j)
                if (data[j] == ':') {
                    errorCode = InvalidPasswordError;
                    break;
                }
        }

        setError(errorCode, input, i);
        return false;
    }

    // no errors
    return true;
}